

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

void __thiscall
SeedTree::SeedTree(SeedTree *this,reveal_list_t *reveallist,size_t num_leaves,limbo_salt_t *salt,
                  size_t rep_idx)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  _Bit_type *p_Var1;
  pointer poVar2;
  int iVar3;
  SeedTree *pSVar4;
  pointer puVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  SeedTree *node_idx;
  size_type __new_size;
  SeedTree *this_01;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_a8;
  char local_90;
  ulong local_88;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_80;
  char local_68;
  undefined7 uStack_67;
  void *local_60;
  long local_58;
  ulong local_50;
  SeedTree *local_48;
  limbo_salt_t *local_40;
  size_t local_38;
  
  this_00 = &this->_node_exists;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_num_leaves = num_leaves;
  uVar7 = (int)num_leaves - 1;
  if (uVar7 == 0) {
    bVar6 = 0;
  }
  else {
    iVar3 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    bVar6 = (byte)iVar3 ^ 0x1f;
  }
  bVar6 = 0x20 - bVar6;
  if ((int)num_leaves == 0) {
    bVar6 = 0;
  }
  __new_size = ((long)(2 << (bVar6 & 0x1f)) + (num_leaves - (long)(1 << (bVar6 & 0x1f)))) - 1;
  this->_num_total_nodes = __new_size;
  local_40 = salt;
  local_38 = rep_idx;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,__new_size,false);
  p_Var1 = (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar8 = this->_num_total_nodes - num_leaves;
  if (uVar8 < this->_num_total_nodes) {
    do {
      uVar10 = uVar8 + 0x3f;
      if (-1 < (long)uVar8) {
        uVar10 = uVar8;
      }
      p_Var1[((long)uVar10 >> 6) +
             (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
           p_Var1[((long)uVar10 >> 6) +
                  (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
           1L << ((byte)uVar8 & 0x3f);
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->_num_total_nodes);
    uVar8 = this->_num_total_nodes - num_leaves;
  }
  if (uVar8 != 0) {
    uVar10 = uVar8 * 2 + 1;
    do {
      if (uVar10 < this->_num_total_nodes) {
        uVar13 = uVar10 + 0x3f;
        if (-1 < (long)uVar10) {
          uVar13 = uVar10;
        }
        if ((p_Var1[((long)uVar13 >> 6) +
                    (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] >> (uVar10 & 0x3f) & 1) == 0) goto LAB_0011331d;
LAB_00113358:
        uVar13 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar13 = uVar8;
        }
        p_Var1[((long)uVar13 >> 6) +
               (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
             p_Var1[((long)uVar13 >> 6) +
                    (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
             | 1L << ((byte)uVar8 & 0x3f);
      }
      else {
LAB_0011331d:
        uVar13 = uVar10 + 1;
        if (uVar13 < this->_num_total_nodes) {
          uVar11 = uVar10 + 0x40;
          if (-1 < (long)uVar13) {
            uVar11 = uVar13;
          }
          if ((p_Var1[((long)uVar11 >> 6) +
                      (ulong)((uVar13 & 0x800000000000003e) < 0x8000000000000001) +
                      0xffffffffffffffff] >> ((uint)uVar13 & 0x3e) & 1) != 0) goto LAB_00113358;
        }
      }
      uVar10 = uVar10 - 2;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  *(byte *)p_Var1 = (byte)*p_Var1 | 1;
  std::
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::resize(&this->_data,this->_num_total_nodes);
  uVar8 = this->_num_total_nodes;
  uVar10 = (reveallist->second + uVar8) - this->_num_leaves;
  if (uVar10 != 0) {
    local_88 = 0x800000000000003e;
    lVar14 = 0;
    do {
      uVar8 = this->_num_total_nodes;
      if (uVar10 < uVar8) {
        p_Var1 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar13 = uVar10 + 0x3f;
        if (-1 < (long)uVar10) {
          uVar13 = uVar10;
        }
        if ((p_Var1[((long)uVar13 >> 6) +
                    (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] >> (uVar10 & 0x3f) & 1) != 0) {
          if ((uVar10 & 1) == 0) {
LAB_00113478:
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&local_80._M_value,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)&(((reveallist->first).
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl + lVar14));
            uVar13 = uVar10 + 1;
            if (uVar8 <= uVar13) {
              uVar13 = 0;
            }
            if ((uVar10 & 1) == 0) {
              uVar13 = uVar10 - 1;
            }
            local_68 = '\x01';
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((this->_data).
                                 super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar13),
                             (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_80._M_value);
            if ((local_68 == '\x01') &&
               (local_68 = '\0',
               local_80._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_80._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_80._M_value.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_80._0_8_);
            }
          }
          else {
            uVar13 = uVar10 + 1;
            if (uVar13 < uVar8) {
              uVar11 = uVar10 + 0x40;
              if (-1 < (long)uVar13) {
                uVar11 = uVar13;
              }
              if ((p_Var1[((long)uVar11 >> 6) +
                          (ulong)((uVar13 & local_88) < 0x8000000000000001) + 0xffffffffffffffff] >>
                   ((uint)uVar13 & 0x3e) & 1) != 0) goto LAB_00113478;
            }
          }
        }
      }
      lVar14 = lVar14 + 0x18;
      uVar10 = (uVar10 + 1 >> 1) - 1;
    } while (uVar10 != 0);
    uVar8 = this->_num_total_nodes;
  }
  this_01 = (SeedTree *)((uVar8 >> 1) - 1);
  lVar15 = 0x20;
  uVar8 = 1;
  lVar14 = 0;
  local_88 = 0x800000000000003f;
  local_50 = 0x800000000000003e;
  node_idx = (SeedTree *)0x0;
  local_48 = this_01;
  do {
    if (node_idx < (SeedTree *)this->_num_total_nodes) {
      pSVar4 = (SeedTree *)
               ((long)&(node_idx->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage + 7);
      if (-1 < (long)node_idx) {
        pSVar4 = node_idx;
      }
      if ((((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)pSVar4 >> 6) +
             (ulong)(((ulong)node_idx & local_88) < 0x8000000000000001) + 0xffffffffffffffff] >>
            ((ulong)node_idx & 0x3f) & 1) != 0) &&
         (poVar2 = (this->_data).
                   super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         *(char *)((long)&(poVar2->
                          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                          )._M_payload + lVar14 + 0x18) == '\x01')) {
        expandSeed((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_80._M_value,this_01,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(poVar2->
                           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                           )._M_payload + lVar14),local_40,local_38,(size_t)node_idx);
        uVar10 = this->_num_total_nodes;
        if (uVar8 < uVar10) {
          uVar13 = uVar8 + 0x3f;
          if (-1 < (long)uVar8) {
            uVar13 = uVar8;
          }
          if (((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar13 >> 6) +
                (ulong)((uVar8 & local_88) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar8 & 0x3f) & 1) != 0) {
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar10 = (long)local_80._M_value.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - local_80._0_8_;
            if (uVar10 == 0) {
              puVar5 = (pointer)0x0;
              sVar9 = 0;
            }
            else {
              if ((long)uVar10 < 0) {
                std::__throw_bad_alloc();
              }
              puVar5 = (pointer)operator_new(uVar10);
              sVar9 = (long)local_80._M_value.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - local_80._0_8_;
            }
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = puVar5 + uVar10;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar5;
            if (local_80._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_80._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar5;
              memmove(puVar5,local_80._M_value.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,sVar9);
            }
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar5 + sVar9;
            local_90 = '\x01';
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(((this->_data).
                                          super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        )._M_payload + lVar15),
                             (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_a8._M_value);
            if ((local_90 == '\x01') &&
               (local_90 = '\0',
               local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_a8._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8._M_value.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_a8._0_8_);
            }
            uVar10 = this->_num_total_nodes;
          }
        }
        uVar13 = uVar8 + 1;
        if (uVar13 < uVar10) {
          uVar10 = uVar8 + 0x40;
          if (-1 < (long)uVar13) {
            uVar10 = uVar13;
          }
          if (((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar10 >> 6) +
                (ulong)((uVar13 & local_50) < 0x8000000000000001) + 0xffffffffffffffff] >>
               ((uint)uVar13 & 0x3e) & 1) != 0) {
            pvVar12 = (void *)CONCAT71(uStack_67,local_68);
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar10 = (long)local_60 - (long)pvVar12;
            if (uVar10 == 0) {
              puVar5 = (pointer)0x0;
              sVar9 = 0;
            }
            else {
              if ((long)uVar10 < 0) {
                std::__throw_bad_alloc();
              }
              puVar5 = (pointer)operator_new(uVar10);
              pvVar12 = (void *)CONCAT71(uStack_67,local_68);
              sVar9 = (long)local_60 - (long)pvVar12;
            }
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = puVar5 + uVar10;
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar5;
            if (local_60 != pvVar12) {
              local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar5;
              memmove(puVar5,pvVar12,sVar9);
            }
            local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar5 + sVar9;
            local_90 = '\x01';
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(this->_data).
                                        super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        ._M_payload + lVar15),
                             (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_a8._M_value);
            if ((local_90 == '\x01') &&
               (local_90 = '\0',
               local_a8._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_a8._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8._M_value.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_a8._0_8_);
            }
          }
        }
        pvVar12 = (void *)CONCAT71(uStack_67,local_68);
        if (pvVar12 != (void *)0x0) {
          operator_delete(pvVar12,local_58 - (long)pvVar12);
        }
        this_01 = local_48;
        if (local_80._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80._M_value.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80._M_value.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - local_80._0_8_);
          this_01 = local_48;
        }
      }
    }
    node_idx = (SeedTree *)
               ((long)&(node_idx->_data).
                       super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    lVar15 = lVar15 + 0x40;
    uVar8 = uVar8 + 2;
    lVar14 = lVar14 + 0x20;
  } while (node_idx <= this_01);
  return;
}

Assistant:

SeedTree::SeedTree(const reveal_list_t &reveallist, const size_t num_leaves,
                   const limbo_salt_t &salt, const size_t rep_idx)
    : _data(), _node_exists(), _num_leaves(num_leaves) {
  size_t tree_depth = 1 + ceil_log2(num_leaves);

  _num_total_nodes =
      ((1 << (tree_depth)) - 1) -
      ((1 << (tree_depth - 1)) -
       num_leaves); /* Num nodes in complete - number of missing leaves */

  _node_exists.resize(_num_total_nodes);
  for (size_t i = _num_total_nodes - num_leaves; i < _num_total_nodes; i++) {
    _node_exists[i] = true;
  }

  for (size_t i = _num_total_nodes - num_leaves; i > 0; i--) {
    if (node_exists(2 * i + 1) || node_exists(2 * i + 2)) {
      _node_exists[i] = true;
    }
  }
  _node_exists[0] = true;
  _data.resize(_num_total_nodes);

  auto has_sibling = [this](size_t node) -> bool {
    if (!node_exists(node)) {
      return 0;
    }

    if ((node % 2 == 1) && !node_exists(node + 1)) {
      return 0;
    }

    return 1;
  };

  auto get_sibling = [this, has_sibling](size_t node) -> size_t {
    assert(node < _num_total_nodes);
    assert(node != 0);
    assert(has_sibling(node));
    if ((node % 2 == 1)) {
      if (node + 1 < _num_total_nodes) {
        return node + 1;
      } else {
        assert(!"getSibling: request for node with no sibling");
        return 0;
      }
    } else {
      return node - 1;
    }
  };

  size_t missing_leaf = reveallist.second;
  size_t first_leaf_idx = _num_total_nodes - _num_leaves;
  size_t path_idx = 0;
  for (size_t node = first_leaf_idx + missing_leaf; node != 0;
       node = get_parent(node)) {
    if (!has_sibling(node)) {
      path_idx++;
      continue;
    }
    size_t sibling = get_sibling(node);
    _data[sibling] = std::optional(reveallist.first[path_idx]);
    path_idx++;
  }

  size_t last_non_leaf = get_parent(_num_total_nodes - 1);
  for (size_t i = 0; i <= last_non_leaf; i++) {
    if (!node_exists(i) || !_data[i].has_value())
      continue;
    auto [left, right] = expandSeed(_data[i].value(), salt, rep_idx, i);
    if (node_exists(2 * i + 1)) {
      _data[2 * i + 1] = std::optional(left);
    }
    if (node_exists(2 * i + 2)) {
      _data[2 * i + 2] = std::optional(right);
    }
  }
}